

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

bool __thiscall
ON_ModelComponent::Internal_SetAsSystemComponent(ON_ModelComponent *this,bool bUnsetSystemComponent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ON_NameHash *pOVar5;
  
  if (this->m_locked_status == 0xffff) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x30f,"","component is already a system component.");
LAB_00544d32:
    bVar1 = true;
  }
  else {
    bVar1 = IndexRequired(this->m_component_type);
    bVar2 = UniqueNameRequired(this->m_component_type);
    bVar3 = UniqueNameIncludesParent(this->m_component_type);
    bVar4 = ParentIdIsNotNil(this);
    if (((!bVar4) && (bVar3 == (bool)(((byte)this->m_set_status & 0x40) >> 6))) &&
       (bVar3 = IdIsNil(this), bVar3 == bUnsetSystemComponent)) {
      if (bVar1 && !bUnsetSystemComponent) {
        if (((this->m_set_status & 0x10) != 0) && (0x80000001 < (uint)this->m_component_index))
        goto LAB_00544d5f;
      }
      else if ((this->m_set_status & 0x10) == 0) {
LAB_00544d5f:
        bVar1 = ON_ComponentStatus::operator!=(&this->m_component_status,this->m_component_status);
        if (!bVar1) {
          if (bVar2 && !bUnsetSystemComponent) {
            bVar1 = NameIsNotEmpty(this);
            if (!bVar1) goto LAB_00544cec;
            pOVar5 = NameHash(this);
            bVar1 = ON_NameHash::IsValidAndNotEmpty(pOVar5);
          }
          else {
            if ((this->m_set_status & 0x20) != 0) {
              return false;
            }
            pOVar5 = NameHash(this);
            bVar1 = ON_NameHash::IsEmptyNameHash(pOVar5);
          }
          if (bVar1 != false) {
            this->m_locked_status = 0xffff;
            this->m_content_version_number = 0;
            goto LAB_00544d32;
          }
        }
      }
    }
LAB_00544cec:
    bVar1 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x350,"","Invalid settings for a system component.");
  }
  return bVar1;
}

Assistant:

bool ON_ModelComponent::Internal_SetAsSystemComponent(
  bool bUnsetSystemComponent
  )
{
  if (m_locked_status == 0xFFFFU)
  {
    ON_ERROR("component is already a system component.");
    return true;
  }

  const bool bIndexRequired = ON_ModelComponent::IndexRequired(m_component_type);
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(m_component_type);
  const bool bUniqueNameIncludesParent = ON_ModelComponent::UniqueNameIncludesParent(m_component_type);

  for (;;)
  {
    if (ParentIdIsNotNil())
      break;

    if (bUniqueNameIncludesParent != ParentIdIsSet())
      break;
    
    if (IdIsNil())
    {
      if (!bUnsetSystemComponent)
        break;
    }
    else
    {
      if (bUnsetSystemComponent)
        break;
    }
    
    if ( bIndexRequired && false == bUnsetSystemComponent )
    {
      if (false == IndexIsSet())
        break;
      if (Index() >= 0)
        break;
      if (Index() <= ON_UNSET_INT_INDEX)
        break;
    }
    else
    {
      if (IndexIsSet())
        break;
    }
    
    if ( ON_ModelComponent::m_component_status != m_component_status ) 
      break;

    if (bUniqueNameRequired && false == bUnsetSystemComponent)
    {
      if (false == NameIsNotEmpty())
        break;
      if (false == NameHash().IsValidAndNotEmpty())
        break;
    }
    else
    {
      if (NameIsSet())
        return false;
      if (false == NameHash().IsEmptyNameHash())
        break;
    }

    m_locked_status = 0xFFFFU;
    m_content_version_number = 0;
    return true;
  }

  ON_ERROR("Invalid settings for a system component.");
  return false;
}